

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

void __thiscall xLearn::Solver::init_log(Solver *this)

{
  undefined8 uVar1;
  string *in_RDI;
  string prefix;
  string *in_stack_000000a8;
  string *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff70;
  string local_78 [32];
  string local_58 [48];
  string local_28 [40];
  
  get_log_file(in_stack_000000a8);
  if (((byte)in_RDI->_M_dataplus & 1) == 0) {
    std::__cxx11::string::operator+=(local_28,"_predict");
  }
  else {
    std::__cxx11::string::operator+=(local_28,"_train");
  }
  uVar1 = std::__cxx11::string::c_str();
  StringPrintf_abi_cxx11_((char *)local_58,"%s.INFO",uVar1);
  uVar1 = std::__cxx11::string::c_str();
  StringPrintf_abi_cxx11_((char *)local_78,"%s.WARN",uVar1);
  uVar1 = std::__cxx11::string::c_str();
  StringPrintf_abi_cxx11_(&stack0xffffffffffffff68,"%s.ERROR",uVar1);
  InitializeLogger(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_RDI);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void Solver::init_log() {
  std::string prefix = get_log_file(hyper_param_.log_file);
  if (hyper_param_.is_train) {
    prefix += "_train";
  } else {
    prefix += "_predict";
  }
  InitializeLogger(StringPrintf("%s.INFO", prefix.c_str()),
              StringPrintf("%s.WARN", prefix.c_str()),
              StringPrintf("%s.ERROR", prefix.c_str()));
}